

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeNativeBuiltin
          (Interpreter *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *params)

{
  bool bVar1;
  const_iterator params_00;
  Identifier *__args;
  string *in_RDX;
  long in_RDI;
  Value VVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Params hc_params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  *in_stack_ffffffffffffff50;
  UString *in_stack_ffffffffffffff70;
  Allocator *in_stack_ffffffffffffff78;
  Interpreter *in_stack_ffffffffffffffc0;
  
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
            *)0x239229);
  params_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(in_stack_ffffffffffffff38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&stack0xffffffffffffffb0);
    in_stack_ffffffffffffff50 =
         *(vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
           **)(in_RDI + 0x78);
    decode_utf8((string *)in_stack_ffffffffffffff78);
    __args = Allocator::makeIdentifier(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>>
    ::emplace_back<jsonnet::internal::Identifier_const*,decltype(nullptr)>
              (in_stack_ffffffffffffff50,(Identifier **)__args,
               (void **)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&stack0xffffffffffffffb0);
  }
  VVar2 = makeBuiltin(in_stack_ffffffffffffffc0,in_RDX,(Params *)params_00._M_current);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ::~vector(in_stack_ffffffffffffff50);
  VVar2._4_4_ = 0;
  return VVar2;
}

Assistant:

Value makeNativeBuiltin(const std::string &name, const std::vector<std::string> &params)
    {
        HeapClosure::Params hc_params;
        for (const auto &p : params) {
            hc_params.emplace_back(alloc->makeIdentifier(decode_utf8(p)), nullptr);
        }
        return makeBuiltin(name, hc_params);
    }